

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O1

void valignd(PDISASM pMyDisasm)

{
  undefined8 uVar1;
  
  if (((pMyDisasm->Reserved_).EVEX.state == '\x01') && ((pMyDisasm->Reserved_).VEX.pp == '\x01')) {
    uVar1 = 0x646e67696c6176;
    if ((pMyDisasm->Reserved_).EVEX.W == '\x01') {
      uVar1 = 0x716e67696c6176;
    }
    *(undefined8 *)(pMyDisasm->Instruction).Mnemonic = uVar1;
    ArgsVEX(pMyDisasm);
    getImmediat8(&pMyDisasm->Operand4,pMyDisasm);
    return;
  }
  builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
  (pMyDisasm->Operand1).AccessMode = 0;
  (pMyDisasm->Operand2).AccessMode = 0;
  (pMyDisasm->Operand3).AccessMode = 0;
  (pMyDisasm->Operand4).AccessMode = 0;
  (pMyDisasm->Operand5).AccessMode = 0;
  (pMyDisasm->Operand6).AccessMode = 0;
  (pMyDisasm->Operand7).AccessMode = 0;
  (pMyDisasm->Operand8).AccessMode = 0;
  (pMyDisasm->Operand9).AccessMode = 0;
  (pMyDisasm->Reserved_).ERROR_OPCODE = -1;
  return;
}

Assistant:

void __bea_callspec__ valignd(PDISASM pMyDisasm)
{
  if (GV.EVEX.state == InUsePrefix) {
    if (GV.VEX.pp == 1) {
      if (GV.EVEX.W == 1) {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "valignq");
        #endif
      }
      else {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "valignd");
        #endif
      }
      ArgsVEX(pMyDisasm);
      getImmediat8(&pMyDisasm->Operand4, pMyDisasm);
    }
    else {
      failDecode(pMyDisasm);
    }

  }
  else {
    failDecode(pMyDisasm);
  }

}